

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O1

void __thiscall Trainer::Node::updateStrategy(Node *this)

{
  byte bVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  if (this->mNeedToUpdateStrategy == true) {
    bVar1 = this->mActionNum;
    uVar4 = (ulong)bVar1;
    if (uVar4 == 0) {
      dVar6 = 0.0;
    }
    else {
      pdVar2 = this->mRegretSum;
      pdVar3 = this->mStrategy;
      uVar5 = 0;
      dVar6 = 0.0;
      do {
        dVar7 = pdVar2[uVar5];
        if (dVar7 <= 0.0) {
          dVar7 = 0.0;
        }
        pdVar3[uVar5] = dVar7;
        dVar6 = dVar6 + dVar7;
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
    if (uVar4 != 0) {
      pdVar2 = this->mStrategy;
      uVar5 = 0;
      do {
        dVar7 = 1.0 / (double)bVar1;
        if (0.0 < dVar6) {
          dVar7 = pdVar2[uVar5] / dVar6;
        }
        pdVar2[uVar5] = dVar7;
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
  }
  return;
}

Assistant:

void Node::updateStrategy() {
    if (!mNeedToUpdateStrategy) {
        return;
    }
    double normalizingSum = 0.0;
    for (int a = 0; a < mActionNum; ++a) {
        mStrategy[a] = mRegretSum[a] > 0 ? mRegretSum[a] : 0;
        normalizingSum += mStrategy[a];
    }
    for (int a = 0; a < mActionNum; ++a) {
        if (normalizingSum > 0) {
            mStrategy[a] /= normalizingSum;
        } else {
            mStrategy[a] = 1.0 / (double) mActionNum;
        }
    }
}